

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_lastIndexOf(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue op1;
  int iVar1;
  BOOL BVar2;
  JSValueUnion JVar3;
  int64_t iVar4;
  ulong idx;
  JSRefCountHeader *p;
  bool bVar5;
  JSValue JVar6;
  int64_t len;
  JSValue val;
  ulong local_50;
  long local_48;
  JSValue local_40;
  
  JVar6 = JS_ToObject(ctx,this_val);
  JVar3 = JVar6.u;
  iVar1 = js_get_length64(ctx,&local_48,JVar6);
  if (iVar1 != 0) {
LAB_00162854:
    if ((0xfffffff4 < (uint)JVar6.tag) &&
       (iVar1 = *JVar3.ptr, *(int *)JVar3.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar6);
    }
    JVar3.float64 = 0.0;
    iVar4 = 6;
    goto LAB_0016297c;
  }
  if (local_48 < 1) {
LAB_00162931:
    idx = 0xffffffffffffffff;
  }
  else {
    local_50 = local_48 - 1;
    if (argc < 2) {
LAB_001628d6:
      idx = local_50;
      do {
        iVar1 = JS_TryGetPropertyInt64(ctx,JVar6,idx,&local_40);
        if (iVar1 < 0) goto LAB_00162854;
        if (iVar1 != 0) {
          op1 = *argv;
          if (0xfffffff4 < (uint)argv->tag) {
            *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
          }
          BVar2 = js_strict_eq2(ctx,op1,local_40,JS_EQ_STRICT);
          if (BVar2 != 0) goto LAB_00162938;
        }
        bVar5 = 0 < (long)idx;
        idx = idx - 1;
      } while (bVar5);
      goto LAB_00162931;
    }
    idx = 0xffffffffffffffff;
    iVar1 = JS_ToInt64Clamp(ctx,(int64_t *)&local_50,argv[1],-1,local_50,local_48);
    if (iVar1 != 0) goto LAB_00162854;
    if (-1 < (long)local_50) goto LAB_001628d6;
  }
LAB_00162938:
  if ((0xfffffff4 < (uint)JVar6.tag) &&
     (iVar1 = *JVar3.ptr, *(int *)JVar3.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar6);
  }
  bVar5 = (long)(int)idx == idx;
  JVar3.float64 = (double)(long)idx;
  if (bVar5) {
    JVar3.ptr = (void *)(idx & 0xffffffff);
  }
  iVar4 = 7;
  if (bVar5) {
    iVar4 = 0;
  }
LAB_0016297c:
  JVar6.tag = iVar4;
  JVar6.u.float64 = JVar3.float64;
  return JVar6;
}

Assistant:

static JSValue js_array_lastIndexOf(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSValue obj, val;
    int64_t len, n, res;
    int present;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    res = -1;
    if (len > 0) {
        n = len - 1;
        if (argc > 1) {
            if (JS_ToInt64Clamp(ctx, &n, argv[1], -1, len - 1, len))
                goto exception;
        }
        /* XXX: should special case fast arrays */
        for (; n >= 0; n--) {
            present = JS_TryGetPropertyInt64(ctx, obj, n, &val);
            if (present < 0)
                goto exception;
            if (present) {
                if (js_strict_eq2(ctx, JS_DupValue(ctx, argv[0]), val, JS_EQ_STRICT)) {
                    res = n;
                    break;
                }
            }
        }
    }
    JS_FreeValue(ctx, obj);
    return JS_NewInt64(ctx, res);

 exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}